

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_promise_finally(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue this_val_00;
  JSValue obj;
  JSValue val;
  JSValue v_04;
  JSValue v_05;
  JSValue JVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  JSContext *in_RDI;
  JSValueUnion *in_R8;
  JSValue JVar5;
  int i;
  JSValue func_data [2];
  JSValue then_funcs [2];
  JSValue ret;
  JSValue ctor;
  JSValue onFinally;
  JSContext *in_stack_fffffffffffffef0;
  JSValueUnion ctx_00;
  JSValueUnion in_stack_fffffffffffffef8;
  JSValueUnion JVar6;
  JSValueUnion in_stack_ffffffffffffff00;
  int64_t local_f8;
  JSValue in_stack_ffffffffffffff10;
  JSValueUnion in_stack_ffffffffffffff20;
  int64_t in_stack_ffffffffffffff28;
  undefined4 uVar7;
  uint in_stack_ffffffffffffff34;
  int data_len;
  undefined4 in_stack_ffffffffffffff40;
  int magic;
  undefined4 in_stack_ffffffffffffff44;
  int length;
  undefined8 in_stack_ffffffffffffff48;
  JSCFunctionData *func;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  JSValueUnion local_88;
  int64_t local_80;
  JSValueUnion local_78;
  int64_t local_70;
  JSValueUnion local_68;
  JSValueUnion local_60;
  JSValueUnion local_58;
  JSCFunctionData *local_50;
  JSValueUnion local_48;
  void *local_40;
  JSContext *local_28;
  int32_t local_10;
  undefined4 uStack_c;
  JSValueUnion local_8;
  
  local_48 = (JSValueUnion)in_R8->ptr;
  local_40 = in_R8[1].ptr;
  uVar7 = 0;
  data_len = 0;
  obj.tag._0_4_ = in_stack_ffffffffffffff50;
  obj.u = (JSValueUnion)in_stack_ffffffffffffff48;
  obj.tag._4_4_ = in_stack_ffffffffffffff54;
  JVar5.tag._0_4_ = in_stack_ffffffffffffff40;
  JVar5.u.float64 = 1.48219693752374e-323;
  JVar5.tag._4_4_ = in_stack_ffffffffffffff44;
  local_28 = in_RDI;
  JVar5 = JS_SpeciesConstructor((JSContext *)((ulong)in_stack_ffffffffffffff34 << 0x20),obj,JVar5);
  magic = JVar5.u._0_4_;
  length = JVar5.u._4_4_;
  func = (JSCFunctionData *)JVar5.tag;
  local_58 = JVar5.u;
  local_50 = func;
  iVar2 = JS_IsException(JVar5);
  if (iVar2 == 0) {
    val.tag = (int64_t)local_40;
    val.u.ptr = local_48.ptr;
    iVar2 = JS_IsFunction(local_28,val);
    if (iVar2 == 0) {
      v_04.tag = (int64_t)local_40;
      v_04.u.ptr = local_48.ptr;
      JVar5 = JS_DupValue(local_28,v_04);
      in_stack_ffffffffffffff20 = JVar5.u;
      in_stack_ffffffffffffff28 = JVar5.tag;
      v_05.tag = (int64_t)local_40;
      v_05.u.ptr = local_48.ptr;
      local_88 = in_stack_ffffffffffffff20;
      local_80 = in_stack_ffffffffffffff28;
      in_stack_ffffffffffffff10 = JS_DupValue(local_28,v_05);
      local_78 = in_stack_ffffffffffffff10.u;
      local_70 = in_stack_ffffffffffffff10.tag;
    }
    else {
      for (iVar2 = 0; iVar2 < 2; iVar2 = iVar2 + 1) {
        lVar4 = (long)iVar2;
        JVar5 = JS_NewCFunctionData((JSContext *)CONCAT44(iVar2,in_stack_ffffffffffffff50),func,
                                    length,magic,data_len,
                                    (JSValue *)CONCAT44(in_stack_ffffffffffffff34,uVar7));
        in_stack_ffffffffffffff00 = JVar5.u;
        local_f8 = JVar5.tag;
        (&local_88)[lVar4 * 2].ptr = (void *)in_stack_ffffffffffffff00;
        (&local_80)[lVar4 * 2] = local_f8;
        iVar3 = JS_IsException(*(JSValue *)(&local_88 + (long)iVar2 * 2));
        if (iVar3 != 0) {
          if (iVar2 == 1) {
            v.tag = (int64_t)in_stack_ffffffffffffff00.ptr;
            v.u.ptr = in_stack_fffffffffffffef8.ptr;
            JS_FreeValue(in_stack_fffffffffffffef0,v);
          }
          v_00.tag = (int64_t)in_stack_ffffffffffffff00.ptr;
          v_00.u.ptr = in_stack_fffffffffffffef8.ptr;
          JS_FreeValue(in_stack_fffffffffffffef0,v_00);
          local_10 = 0;
          local_8.float64 = 2.96439387504748e-323;
          goto LAB_00181e85;
        }
      }
    }
    v_01.tag = (int64_t)in_stack_ffffffffffffff00.ptr;
    v_01.u.float64 = in_stack_fffffffffffffef8.float64;
    JS_FreeValue(in_stack_fffffffffffffef0,v_01);
    this_val_00.tag._0_4_ = uVar7;
    this_val_00.u = (JSValueUnion)in_stack_ffffffffffffff28;
    this_val_00.tag._4_4_ = in_stack_ffffffffffffff34;
    JVar5 = JS_Invoke((JSContext *)in_stack_ffffffffffffff20.ptr,this_val_00,
                      in_stack_ffffffffffffff10.tag._4_4_,(int)in_stack_ffffffffffffff10.tag,
                      (JSValue *)in_stack_ffffffffffffff10.u.ptr);
    ctx_00 = JVar5.u;
    JVar6 = (JSValueUnion)JVar5.tag;
    v_02.tag = (int64_t)in_stack_ffffffffffffff00.ptr;
    v_02.u.ptr = JVar6.ptr;
    local_68 = ctx_00;
    local_60 = JVar6;
    JS_FreeValue((JSContext *)ctx_00.ptr,v_02);
    v_03.tag = (int64_t)in_stack_ffffffffffffff00.ptr;
    v_03.u.ptr = JVar6.ptr;
    JS_FreeValue((JSContext *)ctx_00.ptr,v_03);
    local_10 = local_68.int32;
    uStack_c = local_68._4_4_;
    local_8.float64 = local_60.float64;
  }
  else {
    local_10 = local_58.int32;
    uStack_c = local_58._4_4_;
    local_8.ptr = local_50;
  }
LAB_00181e85:
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = (int64_t)local_8.ptr;
  return JVar1;
}

Assistant:

static JSValue js_promise_finally(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    JSValueConst onFinally = argv[0];
    JSValue ctor, ret;
    JSValue then_funcs[2];
    JSValueConst func_data[2];
    int i;

    ctor = JS_SpeciesConstructor(ctx, this_val, JS_UNDEFINED);
    if (JS_IsException(ctor))
        return ctor;
    if (!JS_IsFunction(ctx, onFinally)) {
        then_funcs[0] = JS_DupValue(ctx, onFinally);
        then_funcs[1] = JS_DupValue(ctx, onFinally);
    } else {
        func_data[0] = ctor;
        func_data[1] = onFinally;
        for(i = 0; i < 2; i++) {
            then_funcs[i] = JS_NewCFunctionData(ctx, js_promise_then_finally_func, 1, i, 2, func_data);
            if (JS_IsException(then_funcs[i])) {
                if (i == 1)
                    JS_FreeValue(ctx, then_funcs[0]);
                JS_FreeValue(ctx, ctor);
                return JS_EXCEPTION;
            }
        }
    }
    JS_FreeValue(ctx, ctor);
    ret = JS_Invoke(ctx, this_val, JS_ATOM_then, 2, (JSValueConst *)then_funcs);
    JS_FreeValue(ctx, then_funcs[0]);
    JS_FreeValue(ctx, then_funcs[1]);
    return ret;
}